

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall
option::Stats::Stats
          (Stats *this,Descriptor *usage,int argc,char **argv,int min_abbr_len,
          bool single_minus_longopt)

{
  this->buffer_max = 1;
  this->options_max = 1;
  add(this,false,usage,argc,argv,min_abbr_len,single_minus_longopt);
  return;
}

Assistant:

Stats(const Descriptor usage[], int argc, char** argv, int min_abbr_len = 0, //
        bool single_minus_longopt = false) :
      buffer_max(1), options_max(1) // 1 more than necessary as sentinel
  {
    add(false, usage, argc, const_cast<const char**>(argv), min_abbr_len, single_minus_longopt);
  }